

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86DisassemblerDecoder.c
# Opt level: O3

InstrUID decode(OpcodeType type,InstructionContext insnContext,uint8_t opcode,uint8_t modRM)

{
  OpcodeDecision *pOVar1;
  uint uVar2;
  ulong uVar3;
  long lVar4;
  
  switch(type) {
  case TWOBYTE:
    if ("\x01\x02\x03\x04"[insnContext] == 0) {
LAB_00229f16:
      pOVar1 = &emptyTable;
      goto LAB_00229f1d;
    }
    lVar4 = (ulong)("\x01\x02\x03\x04"[insnContext] - 1) << 10;
    pOVar1 = x86DisassemblerTwoByteOpcodes;
    break;
  case THREEBYTE_38:
    if ("\x01\x02\x03\x04"[insnContext] == 0) goto LAB_00229f16;
    lVar4 = (ulong)("\x01\x02\x03\x04"[insnContext] - 1) << 10;
    pOVar1 = x86DisassemblerThreeByte38Opcodes;
    break;
  case THREEBYTE_3A:
    if ("\x01\x02\x03\x04"[insnContext] == 0) goto LAB_00229f16;
    lVar4 = (ulong)("\x01\x02\x03\x04"[insnContext] - 1) << 10;
    pOVar1 = x86DisassemblerThreeByte3AOpcodes;
    break;
  case XOP8_MAP:
    if (""[insnContext] == 0) goto LAB_00229f16;
    lVar4 = (ulong)(""[insnContext] - 1) << 10;
    pOVar1 = x86DisassemblerXOP8Opcodes;
    break;
  case XOP9_MAP:
    if (""[insnContext] == 0) goto LAB_00229f16;
    lVar4 = (ulong)(""[insnContext] - 1) << 10;
    pOVar1 = x86DisassemblerXOP9Opcodes;
    break;
  case XOPA_MAP:
    if (""[insnContext] == 0) goto LAB_00229f16;
    lVar4 = (ulong)(""[insnContext] - 1) << 10;
    pOVar1 = x86DisassemblerXOPAOpcodes;
    break;
  case T3DNOW_MAP:
    if ("\x01\x02\x03\x04\x05\x06\a\b"[insnContext] == 0) goto LAB_00229f16;
    lVar4 = (ulong)("\x01\x02\x03\x04\x05\x06\a\b"[insnContext] - 1) << 10;
    pOVar1 = x86DisassemblerT3DNOWOpcodes;
    break;
  default:
    if ("\x01\x02\x03\x04"[insnContext] == 0) goto LAB_00229f16;
    lVar4 = (ulong)("\x01\x02\x03\x04"[insnContext] - 1) << 10;
    pOVar1 = x86DisassemblerOneByteOpcodes;
  }
  pOVar1 = (OpcodeDecision *)(&pOVar1->modRMDecisions[0].modrm_type + lVar4);
LAB_00229f1d:
  uVar3 = (ulong)opcode;
  switch(*(uint8_t *)((long)pOVar1 + uVar3 * 4)) {
  case '\0':
    uVar3 = (ulong)*(ushort *)((long)pOVar1 + uVar3 * 4 + 2);
    break;
  case '\x01':
    uVar3 = ((ulong)*(ushort *)((long)pOVar1 + uVar3 * 4 + 2) + 1) - (ulong)(modRM < 0xc0);
    break;
  case '\x02':
    if ((~(uint)modRM & 0xc0) == 0) {
      uVar3 = (ulong)((modRM & 0x3f) + (uint)*(ushort *)((long)pOVar1 + uVar3 * 4 + 2) + 8);
    }
    else {
      uVar3 = (ulong)((modRM >> 3 & 7) + (uint)*(ushort *)((long)pOVar1 + uVar3 * 4 + 2));
    }
    break;
  case '\x03':
    if ((~modRM & 0xc0) == 0) {
      uVar2 = modRM >> 3 & 0xf;
    }
    else {
      uVar2 = modRM >> 3 & 7;
    }
    uVar3 = (ulong)(uVar2 + *(ushort *)((long)pOVar1 + uVar3 * 4 + 2));
    break;
  case '\x04':
    uVar3 = (ulong)modRM + (ulong)*(ushort *)((long)pOVar1 + uVar3 * 4 + 2);
    break;
  default:
    return 0;
  }
  return modRMTable[uVar3];
}

Assistant:

static InstrUID decode(OpcodeType type,
		InstructionContext insnContext,
		uint8_t opcode,
		uint8_t modRM)
{
	const struct ModRMDecision *dec = NULL;
	const uint8_t *indextable = NULL;
	uint8_t index;

	switch (type) {
		default:
		case ONEBYTE:
			indextable = index_x86DisassemblerOneByteOpcodes;
			index = indextable[insnContext];
			if (index)
				dec = &ONEBYTE_SYM[index - 1].modRMDecisions[opcode];
			else
				dec = &emptyTable.modRMDecisions[opcode];
			break;
		case TWOBYTE:
			indextable = index_x86DisassemblerTwoByteOpcodes;
			index = indextable[insnContext];
			if (index)
				dec = &TWOBYTE_SYM[index - 1].modRMDecisions[opcode];
			else
				dec = &emptyTable.modRMDecisions[opcode];
			break;
		case THREEBYTE_38:
			indextable = index_x86DisassemblerThreeByte38Opcodes;
			index = indextable[insnContext];
			if (index)
				dec = &THREEBYTE38_SYM[index - 1].modRMDecisions[opcode];
			else
				dec = &emptyTable.modRMDecisions[opcode];
			break;
		case THREEBYTE_3A:
			indextable = index_x86DisassemblerThreeByte3AOpcodes;
			index = indextable[insnContext];
			if (index)
				dec = &THREEBYTE3A_SYM[index - 1].modRMDecisions[opcode];
			else
				dec = &emptyTable.modRMDecisions[opcode];
			break;
#ifndef CAPSTONE_X86_REDUCE
		case XOP8_MAP:
			indextable = index_x86DisassemblerXOP8Opcodes;
			index = indextable[insnContext];
			if (index)
				dec = &XOP8_MAP_SYM[index - 1].modRMDecisions[opcode];
			else
				dec = &emptyTable.modRMDecisions[opcode];
			break;
		case XOP9_MAP:
			indextable = index_x86DisassemblerXOP9Opcodes;
			index = indextable[insnContext];
			if (index)
				dec = &XOP9_MAP_SYM[index - 1].modRMDecisions[opcode];
			else
				dec = &emptyTable.modRMDecisions[opcode];
			break;
		case XOPA_MAP:
			indextable = index_x86DisassemblerXOPAOpcodes;
			index = indextable[insnContext];
			if (index)
				dec = &XOPA_MAP_SYM[index - 1].modRMDecisions[opcode];
			else
				dec = &emptyTable.modRMDecisions[opcode];
			break;
		case T3DNOW_MAP:
			indextable = index_x86DisassemblerT3DNOWOpcodes;
			index = indextable[insnContext];
			if (index)
				dec = &T3DNOW_MAP_SYM[index - 1].modRMDecisions[opcode];
			else
				dec = &emptyTable.modRMDecisions[opcode];
			break;
#endif
	}

	switch (dec->modrm_type) {
		default:
			//debug("Corrupt table!  Unknown modrm_type");
			return 0;
		case MODRM_ONEENTRY:
			return modRMTable[dec->instructionIDs];
		case MODRM_SPLITRM:
			if (modFromModRM(modRM) == 0x3)
				return modRMTable[dec->instructionIDs+1];
			return modRMTable[dec->instructionIDs];
		case MODRM_SPLITREG:
			if (modFromModRM(modRM) == 0x3)
				return modRMTable[dec->instructionIDs+((modRM & 0x38) >> 3)+8];
			return modRMTable[dec->instructionIDs+((modRM & 0x38) >> 3)];
		case MODRM_SPLITMISC:
			if (modFromModRM(modRM) == 0x3)
				return modRMTable[dec->instructionIDs+(modRM & 0x3f)+8];
			return modRMTable[dec->instructionIDs+((modRM & 0x38) >> 3)];
		case MODRM_FULL:
			return modRMTable[dec->instructionIDs+modRM];
	}
}